

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void test_C2S_UDP_DATA_check(void)

{
  int32_t iVar1;
  int iVar2;
  uint8_t buf4 [5];
  uint8_t buf3 [28];
  uint8_t buf6 [29];
  uint8_t buf5 [29];
  uint8_t buf2 [30];
  uint8_t buf1 [30];
  PipeMsg msg;
  
  MsgHelper::initMsg(&msg,C2S_UDP_DATA);
  buf1[0x10] = '\0';
  buf1[0x11] = '\0';
  buf1[0x12] = '\0';
  buf1[0x13] = '\0';
  buf1[0x14] = '\x01';
  buf1[0x15] = '\0';
  buf1[0x16] = '\0';
  buf1[0x17] = 0xff;
  buf1[0x18] = 0xff;
  buf1[0x19] = '\x01';
  buf1[0x1a] = '\x02';
  buf1[0x1b] = '\x03';
  buf1[0x1c] = '\x04';
  buf1[0x1d] = '\x05';
  buf1[0] = '\x04';
  buf1[1] = '\x02';
  buf1[2] = '\0';
  buf1[3] = '\0';
  buf1[4] = '\0';
  buf1[5] = '\r';
  buf1[6] = '\x04';
  buf1[7] = 0xfe;
  buf1[8] = 0x80;
  buf1[9] = '\0';
  buf1[10] = '\0';
  buf1[0xb] = '\0';
  buf1[0xc] = '\0';
  buf1[0xd] = '\0';
  buf1[0xe] = '\0';
  buf1[0xf] = '\0';
  iVar1 = MsgHelper::deserializeMsg(buf1,0x1e,&msg);
  if (iVar1 != -1) {
    __assert_fail("MsgHelper::deserializeMsg(buf1, sizeof(buf1), &msg) == -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/test/main.cpp"
                  ,0x14e,"void test_C2S_UDP_DATA_check()");
  }
  MsgHelper::destroyMsg(&msg);
  buf2[0x10] = '\0';
  buf2[0x11] = '\0';
  buf2[0x12] = '\0';
  buf2[0x13] = '\0';
  buf2[0x14] = '\x01';
  buf2[0x15] = '\0';
  buf2[0x16] = '\0';
  buf2[0x17] = 0xff;
  buf2[0x18] = 0xff;
  buf2[0x19] = '\x01';
  buf2[0x1a] = '\x02';
  buf2[0x1b] = '\x03';
  buf2[0x1c] = '\x04';
  buf2[0x1d] = '\x05';
  buf2[0] = '\x04';
  buf2[1] = '\x02';
  buf2[2] = '\x01';
  buf2[3] = '\x02';
  buf2[4] = '\x03';
  buf2[5] = '\x04';
  buf2[6] = '\x04';
  buf2[7] = 0xfe;
  buf2[8] = 0x80;
  buf2[9] = '\0';
  buf2[10] = '\0';
  buf2[0xb] = '\0';
  buf2[0xc] = '\0';
  buf2[0xd] = '\0';
  buf2[0xe] = '\0';
  buf2[0xf] = '\0';
  iVar1 = MsgHelper::deserializeMsg(buf2,0x1e,&msg);
  if (iVar1 != -1) {
    __assert_fail("MsgHelper::deserializeMsg(buf2, sizeof(buf2), &msg) == -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/test/main.cpp"
                  ,0x153,"void test_C2S_UDP_DATA_check()");
  }
  MsgHelper::destroyMsg(&msg);
  buf3[0x10] = 'u';
  buf3[0x11] = '.';
  buf3[0x12] = 'c';
  buf3[0x13] = 'o';
  buf3[0x14] = 'm';
  buf3[0x15] = 0xff;
  buf3[0x16] = 0xff;
  buf3[0x17] = '\x01';
  buf3[0x18] = '\x02';
  buf3[0x19] = '\x03';
  buf3[0x1a] = '\x04';
  buf3[0x1b] = '\x05';
  buf3[0] = '\x04';
  buf3[1] = '\x02';
  buf3[2] = '\0';
  buf3[3] = '\0';
  buf3[4] = '\0';
  buf3[5] = '\x1c';
  buf3[6] = '\x03';
  buf3[7] = '\0';
  buf3[8] = 'w';
  buf3[9] = 'w';
  buf3[10] = 'w';
  buf3[0xb] = '.';
  buf3[0xc] = 'b';
  buf3[0xd] = 'a';
  buf3[0xe] = 'i';
  buf3[0xf] = 'd';
  iVar1 = MsgHelper::deserializeMsg(buf3,0x1c,&msg);
  if (iVar1 != -1) {
    __assert_fail("MsgHelper::deserializeMsg(buf3, sizeof(buf3), &msg) == -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/test/main.cpp"
                  ,0x158,"void test_C2S_UDP_DATA_check()");
  }
  MsgHelper::destroyMsg(&msg);
  builtin_memcpy(buf4,"\x04\x02\x03\x03\x03",5);
  iVar1 = MsgHelper::deserializeMsg(buf4,5,&msg);
  if (iVar1 != 0) {
    __assert_fail("MsgHelper::deserializeMsg(buf4, sizeof(buf4), &msg) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/test/main.cpp"
                  ,0x15c,"void test_C2S_UDP_DATA_check()");
  }
  MsgHelper::destroyMsg(&msg);
  buf5[0x10] = 'u';
  buf5[0x11] = '.';
  buf5[0x12] = 'c';
  buf5[0x13] = 'o';
  buf5[0x14] = 'm';
  buf5[0x15] = 0xff;
  buf5[0x16] = 0xff;
  buf5[0x17] = '\x01';
  buf5[0x18] = '\x02';
  buf5[0x19] = '\x03';
  buf5[0x1a] = '\x04';
  buf5[0x1b] = '\x05';
  buf5[0x1c] = 0xee;
  buf5[0] = '\x04';
  buf5[1] = '\x02';
  buf5[2] = '\0';
  buf5[3] = '\0';
  buf5[4] = '\0';
  buf5[5] = '\x1c';
  buf5[6] = '\x03';
  buf5[7] = '\r';
  buf5[8] = 'w';
  buf5[9] = 'w';
  buf5[10] = 'w';
  buf5[0xb] = '.';
  buf5[0xc] = 'b';
  buf5[0xd] = 'a';
  buf5[0xe] = 'i';
  buf5[0xf] = 'd';
  iVar1 = MsgHelper::deserializeMsg(buf5,0x1d,&msg);
  if (iVar1 != 0x1c) {
    __assert_fail("MsgHelper::deserializeMsg(buf5, sizeof(buf5), &msg) == 28",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/test/main.cpp"
                  ,0x160,"void test_C2S_UDP_DATA_check()");
  }
  iVar2 = bcmp("www.baidu.com",(void *)((long)&msg.field_1 + 0x14),0xe);
  if (iVar2 != 0) {
    __assert_fail("strcmp(\"www.baidu.com\", msg.common_udp_data.ADDR.ADDR) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/test/main.cpp"
                  ,0x161,"void test_C2S_UDP_DATA_check()");
  }
  if (msg.field_1.common_udp_data.ADDR.PORT != 0xffff) {
    __assert_fail("msg.common_udp_data.ADDR.PORT == 65535",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/test/main.cpp"
                  ,0x162,"void test_C2S_UDP_DATA_check()");
  }
  MsgHelper::destroyMsg(&msg);
  buf6[0x10] = 'u';
  buf6[0x11] = '.';
  buf6[0x12] = 'c';
  buf6[0x13] = 'o';
  buf6[0x14] = 'm';
  buf6[0x15] = 0xff;
  buf6[0x16] = 0xff;
  buf6[0x17] = '\x01';
  buf6[0x18] = '\x02';
  buf6[0x19] = '\x03';
  buf6[0x1a] = '\x04';
  buf6[0x1b] = '\x05';
  buf6[0x1c] = 0xee;
  buf6[0] = '\x04';
  buf6[1] = '\x02';
  buf6[2] = '\0';
  buf6[3] = '\0';
  buf6[4] = '\0';
  buf6[5] = '\x17';
  buf6[6] = '\x03';
  buf6[7] = '\r';
  buf6[8] = 'w';
  buf6[9] = 'w';
  buf6[10] = 'w';
  buf6[0xb] = '.';
  buf6[0xc] = 'b';
  buf6[0xd] = 'a';
  buf6[0xe] = 'i';
  buf6[0xf] = 'd';
  iVar1 = MsgHelper::deserializeMsg(buf6,0x1d,&msg);
  if (iVar1 == -1) {
    MsgHelper::destroyMsg(&msg);
    return;
  }
  __assert_fail("MsgHelper::deserializeMsg(buf6, sizeof(buf6), &msg) == -1",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/test/main.cpp"
                ,0x168,"void test_C2S_UDP_DATA_check()");
}

Assistant:

void test_C2S_UDP_DATA_check()
{
	PipeMsg msg;
	MsgHelper::initMsg(&msg, PIPEMSG_TYPE::C2S_UDP_DATA);
	
	// error: len(0x0d) < min
	const uint8_t buf1[] = {0x04, 0x02, 0x00, 0x00, 0x00, 0x0D, 0x04, 0xFE, 0x80, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x01, 0x00, 0x00, 0xFF, 0xFF, 0x01, 0x02, 0x03, 0x04, 0x05};
	assert(MsgHelper::deserializeMsg(buf1, sizeof(buf1), &msg) == -1);
	MsgHelper::destroyMsg(&msg);
	
	// error: len(0x01020301) overflow
	const uint8_t buf2[] = {0x04, 0x02, 0x01, 0x02, 0x03, 0x04, 0x04, 0xFE, 0x80, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x01, 0x00, 0x00, 0xFF, 0xFF, 0x01, 0x02, 0x03, 0x04, 0x05};
	assert(MsgHelper::deserializeMsg(buf2, sizeof(buf2), &msg) == -1);
	MsgHelper::destroyMsg(&msg);
	
	// error: domain len(0x00)
	const uint8_t buf3[] = {0x04, 0x02, 0x00, 0x00, 0x00, 0x1C, 0x03, 0x00, 0x77, 0x77, 0x77, 0x2E, 0x62, 0x61, 0x69, 0x64, 0x75, 0x2E, 0x63, 0x6F, 0x6D, 0xFF, 0xFF, 0x01, 0x02, 0x03, 0x04, 0x05};
	assert(MsgHelper::deserializeMsg(buf3, sizeof(buf3), &msg) == -1);
	MsgHelper::destroyMsg(&msg);
	
	const uint8_t buf4[] = {0x04, 0x02, 0x03, 0x03, 0x03};
	assert(MsgHelper::deserializeMsg(buf4, sizeof(buf4), &msg) == 0);
	MsgHelper::destroyMsg(&msg);
		
	const uint8_t buf5[] = {0x04, 0x02, 0x00, 0x00, 0x00, 0x1C, 0x03, 0x0D, 0x77, 0x77, 0x77, 0x2E, 0x62, 0x61, 0x69, 0x64, 0x75, 0x2E, 0x63, 0x6F, 0x6D, 0xFF, 0xFF, 0x01, 0x02, 0x03, 0x04, 0x05, 0xEE};
	assert(MsgHelper::deserializeMsg(buf5, sizeof(buf5), &msg) == 28);
	assert(strcmp("www.baidu.com", msg.common_udp_data.ADDR.ADDR) == 0);
	assert(msg.common_udp_data.ADDR.PORT == 65535);
	
	MsgHelper::destroyMsg(&msg);
	
	// error: len(0x17) < min
	const uint8_t buf6[] = {0x04, 0x02, 0x00, 0x00, 0x00, 0x17, 0x03, 0x0D, 0x77, 0x77, 0x77, 0x2E, 0x62, 0x61, 0x69, 0x64, 0x75, 0x2E, 0x63, 0x6F, 0x6D, 0xFF, 0xFF, 0x01, 0x02, 0x03, 0x04, 0x05, 0xEE};
	assert(MsgHelper::deserializeMsg(buf6, sizeof(buf6), &msg) == -1);
	MsgHelper::destroyMsg(&msg);
}